

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O0

void secp256k1_fe_from_storage(secp256k1_fe *r,secp256k1_fe_storage *a)

{
  secp256k1_fe *in_RSI;
  secp256k1_fe *in_RDI;
  
  secp256k1_fe_impl_from_storage(in_RDI,(secp256k1_fe_storage *)in_RSI);
  in_RDI->magnitude = 1;
  in_RDI->normalized = 1;
  secp256k1_fe_verify(in_RSI);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_from_storage(secp256k1_fe *r, const secp256k1_fe_storage *a) {
    secp256k1_fe_impl_from_storage(r, a);
    r->magnitude = 1;
    r->normalized = 1;

    SECP256K1_FE_VERIFY(r);
}